

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom find_atom(JSContext *ctx,char *name)

{
  uint uVar1;
  int iVar2;
  JSAtom JVar3;
  size_t sVar4;
  char *in_RSI;
  long in_RDI;
  JSString *str;
  JSAtomStruct *p;
  int len;
  JSAtom atom;
  char *in_stack_ffffffffffffffd8;
  long lVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar6;
  
  if (*in_RSI != '[') {
    JVar3 = JS_NewAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
    return JVar3;
  }
  sVar4 = strlen(in_RSI + 1);
  uVar1 = (int)sVar4 - 1;
  uVar6 = 0xc5;
  while( true ) {
    if (0xd1 < uVar6) {
      abort();
    }
    lVar5 = *(long *)(*(long *)(*(long *)(in_RDI + 0x18) + 0x60) + (ulong)uVar6 * 8);
    if ((((uint)*(undefined8 *)(lVar5 + 4) & 0x7fffffff) == uVar1) &&
       (iVar2 = memcmp((void *)(lVar5 + 0x10),in_RSI + 1,(long)(int)uVar1), iVar2 == 0)) break;
    uVar6 = uVar6 + 1;
  }
  JVar3 = JS_DupAtom((JSContext *)CONCAT44(uVar6,uVar1),(JSAtom)((ulong)lVar5 >> 0x20));
  return JVar3;
}

Assistant:

static JSAtom find_atom(JSContext *ctx, const char *name)
{
    JSAtom atom;
    int len;

    if (*name == '[') {
        name++;
        len = strlen(name) - 1;
        /* We assume 8 bit non null strings, which is the case for these
           symbols */
        for(atom = JS_ATOM_Symbol_toPrimitive; atom < JS_ATOM_END; atom++) {
            JSAtomStruct *p = ctx->rt->atom_array[atom];
            JSString *str = p;
            if (str->len == len && !memcmp(str->u.str8, name, len))
                return JS_DupAtom(ctx, atom);
        }
        abort();
    } else {
        atom = JS_NewAtom(ctx, name);
    }
    return atom;
}